

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O1

void __thiscall
indigox::utils::Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
RemoveVertex(Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
             *this,VertType v)

{
  size_t *psVar1;
  element_type *g_;
  void *pvVar2;
  ordered_index_impl<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>,_void_*,_&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>::left>,_std::less<void_*>,_boost::multi_index::detail::nth_layer<2,_boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<void_*,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>,_boost::mpl::v_item<boost::bimaps::relation::member_at::left,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
  *this_00;
  edge_desc_impl<boost::undirected_tag,_void_*> e;
  long lVar3;
  iterator iVar4;
  stored_vertex *su;
  VertType local_38;
  void *pvStack_30;
  MolEdgeProp *local_28;
  
  lVar3 = *(long *)((long)v + 0x18);
  if (lVar3 != (long)v + 8) {
    g_ = (this->graph_).
         super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::MolVertProp,_indigox::MolEdgeProp,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    do {
      pvStack_30 = *(void **)(lVar3 + 0x20);
      local_28 = (MolEdgeProp *)(*(long *)(lVar3 + 0x28) + 0x20);
      e.super_edge_base<boost::undirected_tag,_void_*>.m_target = pvStack_30;
      e.super_edge_base<boost::undirected_tag,_void_*>.m_source = v;
      e.m_eproperty = local_28;
      local_38 = v;
      boost::detail::remove_undirected_edge_dispatch<indigox::MolEdgeProp>::
      apply<boost::detail::edge_desc_impl<boost::undirected_tag,void*>,boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::listS,boost::undirectedS,indigox::MolVertProp,indigox::MolEdgeProp,boost::no_property,boost::listS>,boost::listS,boost::setS,boost::undirectedS,indigox::MolVertProp,indigox::MolEdgeProp,boost::no_property,boost::listS>::config>
                (e,(undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::MolVertProp,_indigox::MolEdgeProp,_boost::no_property,_boost::listS>,_boost::listS,_boost::setS,_boost::undirectedS,_indigox::MolVertProp,_indigox::MolEdgeProp,_boost::no_property,_boost::listS>::config>
                    *)g_,local_28);
      lVar3 = *(long *)((long)v + 0x18);
    } while (lVar3 != (long)v + 8);
  }
  pvVar2 = *(void **)((long)v + 0x48);
  psVar1 = (size_t *)
           ((long)&(((this->graph_).
                     super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::MolVertProp,_indigox::MolEdgeProp,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->super_type).m_vertices.
                   super__List_base<void_*,_std::allocator<void_*>_>._M_impl + 0x10);
  *psVar1 = *psVar1 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(pvVar2,0x18);
  if (v != (VertType)0x0) {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)v + 0x38) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)v + 0x38));
    }
    std::
    _Rb_tree<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_indigox::MolEdgeProp>,_boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_indigox::MolEdgeProp>,_std::_Identity<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_indigox::MolEdgeProp>_>,_std::less<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_indigox::MolEdgeProp>_>,_std::allocator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_indigox::MolEdgeProp>_>_>
    ::~_Rb_tree((_Rb_tree<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_indigox::MolEdgeProp>,_boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_indigox::MolEdgeProp>,_std::_Identity<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_indigox::MolEdgeProp>_>,_std::less<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_indigox::MolEdgeProp>_>,_std::allocator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_indigox::MolEdgeProp>_>_>
                 *)v);
    operator_delete(v,0x50);
  }
  local_38 = v;
  iVar4 = boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void*const,boost::bimaps::relation::member_at::left>,boost::bimaps::tags::tagged<unsigned_long_const,boost::bimaps::relation::member_at::right>,true>,void*,&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void*const,boost::bimaps::relation::member_at::left>,boost::bimaps::tags::tagged<unsigned_long_const,boost::bimaps::relation::member_at::right>,true>::left>,std::less<void*>,boost::multi_index::detail::nth_layer<2,boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void*const,boost::bimaps::relation::member_at::left>,boost::bimaps::tags::tagged<unsigned_long_const,boost::bimaps::relation::member_at::right>,mpl_::na,true>,boost::bimaps::detail::bimap_core<void*,unsigned_long,mpl_::na,mpl_::na,mpl_::na>::core_indices,std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void*const,boost::bimaps::relation::member_at::left>,boost::bimaps::tags::tagged<unsigned_long_const,boost::bimaps::relation::member_at::right>,mpl_::na,true>>>,boost::mpl::v_item<boost::bimaps::relation::member_at::left,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
          ::find<void*>((ordered_index_impl<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void*const,boost::bimaps::relation::member_at::left>,boost::bimaps::tags::tagged<unsigned_long_const,boost::bimaps::relation::member_at::right>,true>,void*,&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void*const,boost::bimaps::relation::member_at::left>,boost::bimaps::tags::tagged<unsigned_long_const,boost::bimaps::relation::member_at::right>,true>::left>,std::less<void*>,boost::multi_index::detail::nth_layer<2,boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void*const,boost::bimaps::relation::member_at::left>,boost::bimaps::tags::tagged<unsigned_long_const,boost::bimaps::relation::member_at::right>,mpl_::na,true>,boost::bimaps::detail::bimap_core<void*,unsigned_long,mpl_::na,mpl_::na,mpl_::na>::core_indices,std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void*const,boost::bimaps::relation::member_at::left>,boost::bimaps::tags::tagged<unsigned_long_const,boost::bimaps::relation::member_at::right>,mpl_::na,true>>>,boost::mpl::v_item<boost::bimaps::relation::member_at::left,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                         *)(this->vert_idxmap_).left.super_map_adaptor<_1e6ad140_>.
                           super_ordered_associative_container_adaptor<_140da2db_>.super_type.
                           super_type.dwfb.data,&local_38);
  this_00 = &((this->vert_idxmap_).left.super_map_adaptor<_1e6ad140_>.
              super_ordered_associative_container_adaptor<_140da2db_>.super_type.super_type.dwfb.
             data)->super_type;
  if (iVar4.node !=
      *(ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
        **)(this_00 + -4)) {
    boost::multi_index::detail::
    ordered_index_impl<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>,_void_*,_&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>::left>,_std::less<void_*>,_boost::multi_index::detail::nth_layer<2,_boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<void_*,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>,_boost::mpl::v_item<boost::bimaps::relation::member_at::left,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
    ::erase(this_00,v);
  }
  return;
}

Assistant:

void RemoveVertex(VertType v)
      {
        boost::clear_vertex(v, *graph_);
        boost::remove_vertex(v, *graph_);
        if (vert_idxmap_.left.find(v) != vert_idxmap_.left.end()) {
          vert_idxmap_.left.erase(v);
        }
        
      }